

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O1

natwm_error client_focus_window(natwm_state *state,xcb_window_t window)

{
  client *client;
  
  client = workspace_list_find_window_client(state->workspace_list,window);
  if (client == (client *)0x0) {
    client_set_window_input_focus(state,window);
  }
  else if (client->is_focused == false) {
    client_set_focused(state,client);
  }
  return NO_ERROR;
}

Assistant:

enum natwm_error client_focus_window(struct natwm_state *state, xcb_window_t window)
{
        struct client *client = workspace_list_find_window_client(state->workspace_list, window);

        if (client == NULL) {
                client_set_window_input_focus(state, window);

                return NO_ERROR;
        }

        if (client->is_focused) {
                return NO_ERROR;
        }

        client_set_focused(state, client);

        return NO_ERROR;
}